

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

SelectUtxosRequestStruct * __thiscall
cfd::js::api::json::SelectUtxosRequest::ConvertToStruct
          (SelectUtxosRequestStruct *__return_storage_ptr__,SelectUtxosRequest *this)

{
  CoinSelectionFeeInformationFieldStruct local_d8;
  vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  local_60;
  vector<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
  local_38;
  undefined1 local_19;
  SelectUtxosRequest *local_18;
  SelectUtxosRequest *this_local;
  SelectUtxosRequestStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (SelectUtxosRequest *)__return_storage_ptr__;
  SelectUtxosRequestStruct::SelectUtxosRequestStruct(__return_storage_ptr__);
  core::JsonObjectVector<cfd::js::api::json::UtxoJsonData,_cfd::js::api::UtxoJsonDataStruct>::
  ConvertToStruct(&local_38,&this->utxos_);
  std::vector<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>::
  operator=(&__return_storage_ptr__->utxos,&local_38);
  std::vector<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>::
  ~vector(&local_38);
  __return_storage_ptr__->target_amount = this->target_amount_;
  __return_storage_ptr__->is_elements = (bool)(this->is_elements_ & 1);
  core::
  JsonObjectVector<cfd::js::api::json::TargetAmountMapData,_cfd::js::api::TargetAmountMapDataStruct>
  ::ConvertToStruct(&local_60,&this->targets_);
  std::
  vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ::operator=(&__return_storage_ptr__->targets,&local_60);
  std::
  vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ::~vector(&local_60);
  CoinSelectionFeeInformationField::ConvertToStruct(&local_d8,&this->fee_info_);
  CoinSelectionFeeInformationFieldStruct::operator=(&__return_storage_ptr__->fee_info,&local_d8);
  CoinSelectionFeeInformationFieldStruct::~CoinSelectionFeeInformationFieldStruct(&local_d8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

SelectUtxosRequestStruct SelectUtxosRequest::ConvertToStruct() const {  // NOLINT
  SelectUtxosRequestStruct result;
  result.utxos = utxos_.ConvertToStruct();
  result.target_amount = target_amount_;
  result.is_elements = is_elements_;
  result.targets = targets_.ConvertToStruct();
  result.fee_info = fee_info_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}